

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,EGLint *attribList)

{
  deUint32 dVar1;
  vector<void_*,_std::allocator<void_*>_> *configs;
  EGLint numConfigs;
  allocator_type local_2d;
  uint local_2c;
  
  local_2c = 0;
  (*egl->_vptr_Library[2])(egl,display,attribList,0,0,&local_2c);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar1,"chooseConfig(display, attribList, DE_NULL, 0, &numConfigs)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x75);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (__return_storage_ptr__,(long)(int)local_2c,&local_2d);
  if (0 < (int)local_2c) {
    (*egl->_vptr_Library[2])
              (egl,display,attribList,
               (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl
               .super__Vector_impl_data._M_start,(ulong)local_2c,&local_2c);
    dVar1 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar1,"chooseConfig(display, attribList, &configs.front(), numConfigs, &numConfigs)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x7b);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const EGLint* attribList)
{
	EGLint	numConfigs	= 0;

	EGLU_CHECK_CALL(egl, chooseConfig(display, attribList, DE_NULL, 0, &numConfigs));

	{
		vector<EGLConfig> configs(numConfigs);

		if (numConfigs > 0)
			EGLU_CHECK_CALL(egl, chooseConfig(display, attribList, &configs.front(), numConfigs, &numConfigs));

		return configs;
	}
}